

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_suppression_impl.cc
# Opt level: O1

void __thiscall
webrtc::NoiseSuppressionImpl::AnalyzeCaptureAudio(NoiseSuppressionImpl *this,AudioBuffer *audio)

{
  NsHandle *NS_inst;
  string *psVar1;
  pointer puVar2;
  float **ppfVar3;
  ostream *poVar4;
  size_t channel;
  CritScope cs;
  ulong local_1a8;
  CritScope local_1a0;
  FatalMessage local_198;
  
  if (audio == (AudioBuffer *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/noise_suppression_impl.cc"
               ,0x47);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,"Check failed: audio",0x13);
    std::ios::widen((char)(ostream *)&local_198 + (char)*(undefined8 *)(local_198._0_8_ - 0x18));
    std::ostream::put((char)&local_198);
    poVar4 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"# ",2);
  }
  else {
    rtc::CritScope::CritScope(&local_1a0,this->crit_);
    if (this->enabled_ != true) {
LAB_00182239:
      rtc::CritScope::~CritScope(&local_1a0);
      return;
    }
    local_1a8 = CONCAT44(local_1a8._4_4_,0xa0);
    local_198._0_8_ = AudioBuffer::num_frames_per_band(audio);
    if ((local_1a8 & 0xffffffff) < (ulong)local_198._0_8_) {
      psVar1 = rtc::MakeCheckOpString<unsigned_int,unsigned_long>
                         ((uint *)&local_1a8,(unsigned_long *)&local_198,
                          "160u >= audio->num_frames_per_band()");
    }
    else {
      psVar1 = (string *)0x0;
    }
    if (psVar1 == (string *)0x0) {
      local_198._0_8_ =
           (long)(this->suppressors_).
                 super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->suppressors_).
                 super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3;
      local_1a8 = AudioBuffer::num_channels(audio);
      if (local_198._0_8_ == local_1a8) {
        psVar1 = (string *)0x0;
      }
      else {
        psVar1 = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                           ((unsigned_long *)&local_198,&local_1a8,
                            "suppressors_.size() == audio->num_channels()");
      }
      if (psVar1 == (string *)0x0) {
        puVar2 = (this->suppressors_).
                 super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->suppressors_).
            super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != puVar2) {
          channel = 0;
          do {
            NS_inst = (puVar2[channel]._M_t.
                       super___uniq_ptr_impl<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_webrtc::NoiseSuppressionImpl::Suppressor_*,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>
                       .super__Head_base<0UL,_webrtc::NoiseSuppressionImpl::Suppressor_*,_false>.
                      _M_head_impl)->state_;
            ppfVar3 = AudioBuffer::split_bands_const_f(audio,channel);
            WebRtcNs_Analyze(NS_inst,*ppfVar3);
            channel = channel + 1;
            puVar2 = (this->suppressors_).
                     super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          } while (channel < (ulong)((long)(this->suppressors_).
                                           super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2
                                    >> 3));
        }
        goto LAB_00182239;
      }
      rtc::FatalMessage::FatalMessage
                (&local_198,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/noise_suppression_impl.cc"
                 ,0x4f,psVar1);
    }
    else {
      rtc::FatalMessage::FatalMessage
                (&local_198,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/noise_suppression_impl.cc"
                 ,0x4e,psVar1);
    }
  }
  rtc::FatalMessage::~FatalMessage(&local_198);
}

Assistant:

void NoiseSuppressionImpl::AnalyzeCaptureAudio(AudioBuffer* audio) {
  RTC_DCHECK(audio);
#if defined(WEBRTC_NS_FLOAT)
  rtc::CritScope cs(crit_);
  if (!enabled_) {
    return;
  }

  RTC_DCHECK_GE(160u, audio->num_frames_per_band());
  RTC_DCHECK_EQ(suppressors_.size(), audio->num_channels());
  for (size_t i = 0; i < suppressors_.size(); i++) {
    WebRtcNs_Analyze(suppressors_[i]->state(),
                     audio->split_bands_const_f(i)[kBand0To8kHz]);
  }
#endif
}